

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCSI.cpp
# Opt level: O3

void __thiscall SCSI::Bus::Bus(Bus *this,HalfCycles clock_rate)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  undefined1 auVar4 [16];
  
  (this->super_Source).observer_ = (Observer *)0x0;
  (this->super_Source)._vptr_Source = (_func_int **)&PTR_preferred_clocking_005a30c0;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_005a30e0;
  (this->time_in_state_).super_WrappedInt<HalfCycles>.length_ = 0;
  this->dispatch_index_ = 0;
  auVar4._0_8_ = 1.0 / (double)(long)clock_rate.super_WrappedInt<HalfCycles>.length_;
  (this->device_states_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->device_states_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->device_states_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->device_states_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->observers_).
  super__Vector_base<SCSI::Bus::Observer_*,_std::allocator<SCSI::Bus::Observer_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->observers_).
  super__Vector_base<SCSI::Bus::Observer_*,_std::allocator<SCSI::Bus::Observer_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->observers_).
  super__Vector_base<SCSI::Bus::Observer_*,_std::allocator<SCSI::Bus::Observer_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->activity_observer_ = (Observer *)0x0;
  this->cycles_to_time_ = auVar4._0_8_;
  auVar4._8_8_ = auVar4._0_8_;
  auVar1 = divpd(_DAT_004e1660,auVar4);
  auVar2._8_4_ = 0xffffffff;
  auVar2._0_8_ = 0xffffffffffffffff;
  auVar2._12_4_ = 0xffffffff;
  lVar3 = auVar2._8_8_;
  (this->dispatch_times_)._M_elems[0] = (long)auVar1._0_8_ + 1;
  (this->dispatch_times_)._M_elems[1] = (long)auVar1._8_8_ - lVar3;
  auVar1 = divpd(_DAT_004e1670,auVar4);
  (this->dispatch_times_)._M_elems[2] = (long)auVar1._0_8_ + 1;
  (this->dispatch_times_)._M_elems[3] = (long)auVar1._8_8_ - lVar3;
  auVar1 = divpd(_DAT_004e1680,auVar4);
  (this->dispatch_times_)._M_elems[4] = (long)auVar1._0_8_ + 1;
  (this->dispatch_times_)._M_elems[5] = (long)auVar1._8_8_ - lVar3;
  auVar4 = divpd(_DAT_004e1690,auVar4);
  (this->dispatch_times_)._M_elems[6] = (long)auVar4._0_8_ + 1;
  (this->dispatch_times_)._M_elems[7] = (long)auVar4._8_8_ - lVar3;
  return;
}

Assistant:

Bus::Bus(HalfCycles clock_rate) {
	cycles_to_time_ = 1.0 / double(clock_rate.as_integral());

	// NB: note that the dispatch times below are **ORDERED**
	// from least to greatest. Each box should contain the number
	// of whole clock periods it will take to get the the first
	// discrete moment after the required delay interval has been met.
	using IntType = Cycles::IntType;
	dispatch_times_[0] = 1 + IntType(CableSkew / cycles_to_time_);
	dispatch_times_[1] = 1 + IntType(DeskewDelay / cycles_to_time_);
	dispatch_times_[2] = 1 + IntType(BusFreeDelay / cycles_to_time_);
	dispatch_times_[3] = 1 + IntType(BusSettleDelay / cycles_to_time_);
	dispatch_times_[4] = 1 + IntType(BusClearDelay / cycles_to_time_);
	dispatch_times_[5] = 1 + IntType(BusSetDelay / cycles_to_time_);
	dispatch_times_[6] = 1 + IntType(ArbitrationDelay / cycles_to_time_);
	dispatch_times_[7] = 1 + IntType(ResetHoldTime / cycles_to_time_);
}